

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O0

void cmExtraEclipseCDT4Generator::AppendTarget
               (cmGeneratedFileStream *fout,string *target,string *make,string *makeArgs,
               string *path,char *prefix,char *makeTarget)

{
  ostream *poVar1;
  string local_130;
  undefined1 local_110 [8];
  string pathXml;
  allocator local_c9;
  string local_c8;
  string local_a8;
  string local_78 [8];
  string makeTargetXml;
  string targetXml;
  char *prefix_local;
  string *path_local;
  string *makeArgs_local;
  string *make_local;
  string *target_local;
  cmGeneratedFileStream *fout_local;
  
  EscapeForXML((string *)(makeTargetXml.field_2._M_local_buf + 8),target);
  std::__cxx11::string::string(local_78,(string *)(makeTargetXml.field_2._M_local_buf + 8));
  if (makeTarget != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c8,makeTarget,&local_c9);
    EscapeForXML(&local_a8,&local_c8);
    std::__cxx11::string::operator=(local_78,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  }
  EscapeForXML((string *)((long)&pathXml.field_2 + 8),target);
  std::__cxx11::string::~string((string *)(pathXml.field_2._M_local_buf + 8));
  EscapeForXML((string *)local_110,path);
  poVar1 = std::operator<<((ostream *)fout,"<target name=\"");
  poVar1 = std::operator<<(poVar1,prefix);
  poVar1 = std::operator<<(poVar1,(string *)(makeTargetXml.field_2._M_local_buf + 8));
  poVar1 = std::operator<<(poVar1,"\" path=\"");
  poVar1 = std::operator<<(poVar1,(string *)local_110);
  poVar1 = std::operator<<(poVar1,
                           "\" targetID=\"org.eclipse.cdt.make.MakeTargetBuilder\">\n<buildCommand>"
                          );
  GetEclipsePath(&local_130,make);
  poVar1 = std::operator<<(poVar1,(string *)&local_130);
  poVar1 = std::operator<<(poVar1,"</buildCommand>\n<buildArguments>");
  poVar1 = std::operator<<(poVar1,(string *)makeArgs);
  poVar1 = std::operator<<(poVar1,"</buildArguments>\n<buildTarget>");
  poVar1 = std::operator<<(poVar1,local_78);
  std::operator<<(poVar1,
                  "</buildTarget>\n<stopOnError>true</stopOnError>\n<useDefaultCommand>false</useDefaultCommand>\n</target>\n"
                 );
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)local_110);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string((string *)(makeTargetXml.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::AppendTarget(cmGeneratedFileStream& fout,
                                               const std::string&     target,
                                               const std::string&     make,
                                               const std::string&     makeArgs,
                                               const std::string&     path,
                                               const char* prefix,
                                               const char* makeTarget
                                              )
{
  std::string targetXml = cmExtraEclipseCDT4Generator::EscapeForXML(target);
  std::string makeTargetXml = targetXml;
  if (makeTarget != NULL)
    {
    makeTargetXml = cmExtraEclipseCDT4Generator::EscapeForXML(makeTarget);
    }
  cmExtraEclipseCDT4Generator::EscapeForXML(target);
  std::string pathXml = cmExtraEclipseCDT4Generator::EscapeForXML(path);
  fout <<
    "<target name=\"" << prefix << targetXml << "\""
    " path=\"" << pathXml << "\""
    " targetID=\"org.eclipse.cdt.make.MakeTargetBuilder\">\n"
    "<buildCommand>"
    << cmExtraEclipseCDT4Generator::GetEclipsePath(make)
    << "</buildCommand>\n"
    "<buildArguments>"  << makeArgs << "</buildArguments>\n"
    "<buildTarget>" << makeTargetXml << "</buildTarget>\n"
    "<stopOnError>true</stopOnError>\n"
    "<useDefaultCommand>false</useDefaultCommand>\n"
    "</target>\n"
    ;
}